

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readwritefile.cpp
# Opt level: O0

bool WriteBinaryFile(path *filename,string *data)

{
  long lVar1;
  int iVar2;
  FILE *__s;
  char *__ptr;
  size_type sVar3;
  size_t sVar4;
  char *in_RDI;
  long in_FS_OFFSET;
  FILE *f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = fsbridge::fopen(in_RDI,"wb");
  if (__s == (FILE *)0x0) {
    local_9 = false;
  }
  else {
    __ptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                      (in_stack_ffffffffffffffb8);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (in_stack_ffffffffffffffb8);
    sVar4 = fwrite(__ptr,1,sVar3,__s);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (in_stack_ffffffffffffffb8);
    if (sVar4 == sVar3) {
      iVar2 = fclose(__s);
      if (iVar2 == 0) {
        local_9 = true;
      }
      else {
        local_9 = false;
      }
    }
    else {
      fclose(__s);
      local_9 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteBinaryFile(const fs::path &filename, const std::string &data)
{
    FILE *f = fsbridge::fopen(filename, "wb");
    if (f == nullptr)
        return false;
    if (fwrite(data.data(), 1, data.size(), f) != data.size()) {
        fclose(f);
        return false;
    }
    if (fclose(f) != 0) {
        return false;
    }
    return true;
}